

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace_dogstatsd.cpp
# Opt level: O2

int __thiscall datadog::Dogstatsd::flush(Dogstatsd *this)

{
  int iVar1;
  ssize_t sVar2;
  ostream *poVar3;
  pointer pbVar4;
  allocator local_1f5;
  int local_1f4;
  sockaddr *local_1f0;
  string buffer;
  string local_1c8 [32];
  ostringstream statd;
  string local_1a0 [368];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&statd);
  iVar1 = 0;
  if (this->buffered == true) {
    local_1f0 = (sockaddr *)&this->_server;
    local_1f4 = 0;
    while ((this->cmd_buffer).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           (this->cmd_buffer).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
      iVar1 = std::ostream::tellp();
      pbVar4 = (this->cmd_buffer).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (0xffbb < (long)iVar1 + pbVar4[-1]._M_string_length) {
        std::__cxx11::stringbuf::str();
        sVar2 = sendto(this->_sockfd,buffer._M_dataplus._M_p,buffer._M_string_length,0,local_1f0,
                       0x10);
        std::__cxx11::string::string(local_1c8,"",&local_1f5);
        std::__cxx11::stringbuf::str(local_1a0);
        std::__cxx11::string::~string(local_1c8);
        std::ios::clear((int)*(undefined8 *)(_statd + -0x18) + (int)(ostringstream *)&statd);
        local_1f4 = local_1f4 + (int)sVar2;
        std::__cxx11::string::~string((string *)&buffer);
        pbVar4 = (this->cmd_buffer).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      poVar3 = std::operator<<((ostream *)&statd,(string *)(pbVar4 + -1));
      std::endl<char,std::char_traits<char>>(poVar3);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back(&this->cmd_buffer);
    }
    std::__cxx11::stringbuf::str();
    sVar2 = sendto(this->_sockfd,buffer._M_dataplus._M_p,buffer._M_string_length,0,local_1f0,0x10);
    iVar1 = local_1f4 + (int)sVar2;
    std::__cxx11::string::~string((string *)&buffer);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&statd);
  return iVar1;
}

Assistant:

int Dogstatsd::flush(){
    int ret = 0;
    std::ostringstream statd;
    if(!buffered) {
      return 0;
    }
    while (!cmd_buffer.empty()) {
      if (static_cast<int>(statd.tellp()) + cmd_buffer.back().length() > optimal_payload) {
        std::string buffer(statd.str());
        ret += sendto( _sockfd, buffer.c_str(), buffer.length(), 
            0, (struct sockaddr *)&_server, sizeof(_server));

        //clear the stringstream
        statd.str("");
        statd.clear();
      }
      statd << cmd_buffer.back() << std::endl;
      cmd_buffer.pop_back();
    }

    std::string buffer(statd.str());
    ret += sendto(_sockfd, buffer.c_str(), buffer.length(), 0, (struct sockaddr *)&_server, sizeof(_server));

    return ret;
  }